

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<tinyusdz::value::normal3h> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::normal3h>
          (optional<tinyusdz::value::normal3h> *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  bool bVar3;
  optional<tinyusdz::value::normal3h> local_20;
  
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar3 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar3 = uVar2 == 4;
  }
  if ((bVar3) || ((this->_blocked & 1U) != 0)) {
LAB_001ea2f2:
    __return_storage_ptr__->has_value_ = false;
    *(undefined4 *)&__return_storage_ptr__->contained = 0;
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = 0;
  }
  else {
    pvVar1 = (this->_value).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      if (uVar2 == 0) goto LAB_001ea2f2;
      pvVar1 = (this->_value).v_.vtable;
      if (pvVar1 != (vtable_type *)0x0) {
        uVar2 = (*pvVar1->type_id)();
        if (uVar2 == 1) goto LAB_001ea2f2;
      }
    }
    tinyusdz::value::Value::get_value<tinyusdz::value::normal3h>(&local_20,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_20.has_value_;
    if (local_20.has_value_ == true) {
      *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = local_20.contained._4_2_;
      *(undefined4 *)&__return_storage_ptr__->contained = local_20.contained._0_4_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }